

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_chdir(char *file,wchar_t line,char *pathname)

{
  int iVar1;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = chdir(pathname);
  if (iVar1 != 0) {
    failure_start(file,line,"chdir(\"%s\")",pathname);
    failure_finish(file);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
assertion_chdir(const char *file, int line, const char *pathname)
{
	assertion_count(file, line);
	if (chdir(pathname) == 0)
		return (1);
	failure_start(file, line, "chdir(\"%s\")", pathname);
	failure_finish(NULL);
	return (0);

}